

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

bool checkLabelDefined(Identifier *labelName,int section)

{
  bool bVar1;
  element_type *this;
  undefined1 local_28 [8];
  shared_ptr<Label> label;
  int section_local;
  Identifier *labelName_local;
  
  label.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = section;
  SymbolTable::getLabel
            ((SymbolTable *)local_28,(Identifier *)&Global.symbolTable,(int)labelName,
             Global.FileInfo.FileNum);
  this = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                   ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_28
                   );
  bVar1 = Label::isDefined(this);
  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_28);
  return bVar1;
}

Assistant:

bool checkLabelDefined(const Identifier& labelName, int section)
{
	std::shared_ptr<Label> label = Global.symbolTable.getLabel(labelName,Global.FileInfo.FileNum,section);
	return label->isDefined();
}